

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_input_auth(Curl_easy *data,_Bool proxy,char *auth)

{
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  bool bVar4;
  CURLcode result_1;
  CURLcode result;
  auth *authp;
  unsigned_long *availp;
  connectdata *conn;
  char *auth_local;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  conn = (connectdata *)auth;
  if (proxy) {
    authp = (auth *)&(data->info).proxyauthavail;
    _result_1 = &(data->state).authproxy;
  }
  else {
    authp = (auth *)&(data->info).httpauthavail;
    _result_1 = &(data->state).authhost;
  }
  while ((char)(conn->cnnct).state != CONNECT_INIT) {
    iVar2 = curl_strnequal((char *)conn,"NTLM",4);
    if ((iVar2 == 0) || (iVar2 = is_valid_auth_separator((conn->cnnct).field_0x4), iVar2 == 0)) {
      iVar2 = curl_strnequal((char *)conn,"Digest",6);
      if ((iVar2 == 0) || (iVar2 = is_valid_auth_separator((conn->cnnct).field_0x6), iVar2 == 0)) {
        iVar2 = curl_strnequal((char *)conn,"Basic",5);
        if ((iVar2 == 0) || (iVar2 = is_valid_auth_separator((conn->cnnct).field_0x5), iVar2 == 0))
        {
          iVar2 = curl_strnequal((char *)conn,"Bearer",6);
          if ((iVar2 != 0) && (iVar2 = is_valid_auth_separator((conn->cnnct).field_0x6), iVar2 != 0)
             ) {
            authp->want = authp->want | 0x40;
            _result_1->avail = _result_1->avail | 0x40;
            if (_result_1->picked == 0x40) {
              _result_1->avail = 0;
              Curl_infof(data,"Authentication problem. Ignoring this.");
              *(uint *)&(data->state).field_0x6d0 =
                   *(uint *)&(data->state).field_0x6d0 & 0xffffffdf | 0x20;
            }
          }
        }
        else {
          authp->want = authp->want | 1;
          _result_1->avail = _result_1->avail | 1;
          if (_result_1->picked == 1) {
            _result_1->avail = 0;
            Curl_infof(data,"Authentication problem. Ignoring this.");
            *(uint *)&(data->state).field_0x6d0 =
                 *(uint *)&(data->state).field_0x6d0 & 0xffffffdf | 0x20;
          }
        }
      }
      else if ((_result_1->avail & 2) == 0) {
        _Var1 = Curl_auth_is_digest_supported();
        if (_Var1) {
          authp->want = authp->want | 2;
          _result_1->avail = _result_1->avail | 2;
          CVar3 = Curl_input_digest(data,proxy,(char *)conn);
          if (CVar3 != CURLE_OK) {
            Curl_infof(data,"Authentication problem. Ignoring this.");
            *(uint *)&(data->state).field_0x6d0 =
                 *(uint *)&(data->state).field_0x6d0 & 0xffffffdf | 0x20;
          }
        }
      }
      else {
        Curl_infof(data,"Ignoring duplicate digest auth header.");
      }
    }
    else if ((((_result_1->avail & 8) != 0) || ((_result_1->avail & 0x20) != 0)) ||
            (_Var1 = Curl_auth_is_ntlm_supported(), _Var1)) {
      authp->want = authp->want | 8;
      _result_1->avail = _result_1->avail | 8;
      if ((_result_1->picked == 8) || (_result_1->picked == 0x20)) {
        CVar3 = Curl_input_ntlm(data,proxy,(char *)conn);
        if (CVar3 == CURLE_OK) {
          *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xffffffdf;
        }
        else {
          Curl_infof(data,"Authentication problem. Ignoring this.");
          *(uint *)&(data->state).field_0x6d0 =
               *(uint *)&(data->state).field_0x6d0 & 0xffffffdf | 0x20;
        }
      }
    }
    while( true ) {
      bVar4 = false;
      if ((char)(conn->cnnct).state != CONNECT_INIT) {
        bVar4 = (char)(conn->cnnct).state != 0x2c;
      }
      if (!bVar4) break;
      conn = (connectdata *)((long)&(conn->cnnct).state + 1);
    }
    if ((char)(conn->cnnct).state == 0x2c) {
      conn = (connectdata *)((long)&(conn->cnnct).state + 1);
    }
    while( true ) {
      bVar4 = false;
      if ((((char)(conn->cnnct).state != CONNECT_INIT) &&
          (bVar4 = true, (char)(conn->cnnct).state != 0x20)) &&
         ((bVar4 = true, (char)(conn->cnnct).state != CONNECT_REQ_INIT &&
          (bVar4 = false, '\t' < (char)(conn->cnnct).state)))) {
        bVar4 = (char)(conn->cnnct).state < '\x0e';
      }
      if (!bVar4) break;
      conn = (connectdata *)((long)&(conn->cnnct).state + 1);
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_input_auth(struct Curl_easy *data, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
  struct connectdata *conn = data->conn;
#ifdef USE_SPNEGO
  curlnegotiate *negstate = proxy ? &conn->proxy_negotiate_state :
                                    &conn->http_negotiate_state;
#endif
  unsigned long *availp;
  struct auth *authp;

  (void) conn; /* In case conditionals make it unused. */

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(checkprefix("Negotiate", auth) && is_valid_auth_separator(auth[9])) {
      if((authp->avail & CURLAUTH_NEGOTIATE) ||
         Curl_auth_is_spnego_supported()) {
        *availp |= CURLAUTH_NEGOTIATE;
        authp->avail |= CURLAUTH_NEGOTIATE;

        if(authp->picked == CURLAUTH_NEGOTIATE) {
          CURLcode result = Curl_input_negotiate(data, conn, proxy, auth);
          if(!result) {
            DEBUGASSERT(!data->req.newurl);
            data->req.newurl = strdup(data->state.url);
            if(!data->req.newurl)
              return CURLE_OUT_OF_MEMORY;
            data->state.authproblem = FALSE;
            /* we received a GSS auth token and we dealt with it fine */
            *negstate = GSS_AUTHRECV;
          }
          else
            data->state.authproblem = TRUE;
        }
      }
    }
    else
#endif
#ifdef USE_NTLM
      /* NTLM support requires the SSL crypto libs */
      if(checkprefix("NTLM", auth) && is_valid_auth_separator(auth[4])) {
        if((authp->avail & CURLAUTH_NTLM) ||
           (authp->avail & CURLAUTH_NTLM_WB) ||
           Curl_auth_is_ntlm_supported()) {
          *availp |= CURLAUTH_NTLM;
          authp->avail |= CURLAUTH_NTLM;

          if(authp->picked == CURLAUTH_NTLM ||
             authp->picked == CURLAUTH_NTLM_WB) {
            /* NTLM authentication is picked and activated */
            CURLcode result = Curl_input_ntlm(data, proxy, auth);
            if(!result) {
              data->state.authproblem = FALSE;
#ifdef NTLM_WB_ENABLED
              if(authp->picked == CURLAUTH_NTLM_WB) {
                *availp &= ~CURLAUTH_NTLM;
                authp->avail &= ~CURLAUTH_NTLM;
                *availp |= CURLAUTH_NTLM_WB;
                authp->avail |= CURLAUTH_NTLM_WB;

                result = Curl_input_ntlm_wb(data, conn, proxy, auth);
                if(result) {
                  infof(data, "Authentication problem. Ignoring this.");
                  data->state.authproblem = TRUE;
                }
              }
#endif
            }
            else {
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
        }
      }
      else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
        if(checkprefix("Digest", auth) && is_valid_auth_separator(auth[6])) {
          if((authp->avail & CURLAUTH_DIGEST) != 0)
            infof(data, "Ignoring duplicate digest auth header.");
          else if(Curl_auth_is_digest_supported()) {
            CURLcode result;

            *availp |= CURLAUTH_DIGEST;
            authp->avail |= CURLAUTH_DIGEST;

            /* We call this function on input Digest headers even if Digest
             * authentication isn't activated yet, as we need to store the
             * incoming data from this header in case we are going to use
             * Digest */
            result = Curl_input_digest(data, proxy, auth);
            if(result) {
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
        }
        else
#endif
          if(checkprefix("Basic", auth) &&
             is_valid_auth_separator(auth[5])) {
            *availp |= CURLAUTH_BASIC;
            authp->avail |= CURLAUTH_BASIC;
            if(authp->picked == CURLAUTH_BASIC) {
              /* We asked for Basic authentication but got a 40X back
                 anyway, which basically means our name+password isn't
                 valid. */
              authp->avail = CURLAUTH_NONE;
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
          else
            if(checkprefix("Bearer", auth) &&
               is_valid_auth_separator(auth[6])) {
              *availp |= CURLAUTH_BEARER;
              authp->avail |= CURLAUTH_BEARER;
              if(authp->picked == CURLAUTH_BEARER) {
                /* We asked for Bearer authentication but got a 40X back
                  anyway, which basically means our token isn't valid. */
                authp->avail = CURLAUTH_NONE;
                infof(data, "Authentication problem. Ignoring this.");
                data->state.authproblem = TRUE;
              }
            }

    /* there may be multiple methods on one line, so keep reading */
    while(*auth && *auth != ',') /* read up to the next comma */
      auth++;
    if(*auth == ',') /* if we're on a comma, skip it */
      auth++;
    while(*auth && ISSPACE(*auth))
      auth++;
  }

  return CURLE_OK;
}